

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem *items,int count,float width_excess)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  byte bVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  long extraout_RDX;
  long lVar12;
  ImGuiShrinkWidthItem *pIVar14;
  long in_R8;
  long unaff_R12;
  long unaff_R13;
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  float fVar31;
  undefined1 in_XMM17 [16];
  undefined4 uVar13;
  undefined1 auVar17 [32];
  
  if (count == 1) {
    auVar2 = vmaxss_avx(ZEXT416((uint)(items->Width - width_excess)),ZEXT416(0x3f800000));
    items->Width = auVar2._0_4_;
  }
  else {
    pIVar14 = items;
    qsort(items,(long)count,8,ShrinkWidthItemComparer);
    uVar13 = (undefined4)((ulong)extraout_RDX >> 0x20);
    if (1 < count) {
      auVar2 = vucomiss_avx512f(ZEXT816(0) << 0x40);
      if (2 < (uint)count) {
        auVar20 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar22 = vpbroadcastq_avx512f(ZEXT816(0x10));
        lVar10 = 1;
        auVar23 = vpbroadcastq_avx512f();
        lVar12 = extraout_RDX;
        do {
          fVar31 = items->Width;
          lVar10 = (long)(int)lVar10;
          do {
            if (items[lVar10].Width < fVar31) {
              fVar31 = fVar31 - items[lVar10].Width;
              goto LAB_0024ec26;
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 < count);
          fVar31 = fVar31 + -1.0;
LAB_0024ec26:
          uVar9 = (uint)lVar10;
          auVar3 = vcvtsi2ss_avx512f(in_XMM17,uVar9);
          auVar15 = vdivss_avx512f(auVar2,auVar3);
          auVar15 = vminss_avx(auVar15,ZEXT416((uint)fVar31));
          if (0 < (int)uVar9) {
            auVar24 = vbroadcastss_avx512f(auVar15);
            auVar25 = vmovdqa64_avx512f(auVar21);
            auVar26 = vmovdqa64_avx512f(auVar20);
            lVar12 = (ulong)(uVar9 & 0x7fffffff) - 1;
            uVar11 = (ulong)(uVar9 + 0xf & 0xfffffff0);
            auVar27 = vpbroadcastq_avx512f();
            do {
              auVar28 = vpsllq_avx512f(auVar26,3);
              uVar5 = vpcmpuq_avx512f(auVar26,auVar27,2);
              auVar29 = vpsllq_avx512f(auVar25,3);
              uVar6 = vpcmpuq_avx512f(auVar25,auVar27,2);
              auVar25 = vpaddq_avx512f(auVar25,auVar22);
              auVar26 = vpaddq_avx512f(auVar26,auVar22);
              uVar11 = uVar11 - 0x10;
              auVar28 = vpaddq_avx512f(auVar23,auVar28);
              auVar29 = vpaddq_avx512f(auVar23,auVar29);
              auVar16 = vgatherqps_avx512f(*(undefined8 *)(unaff_R13 + 4));
              auVar17._8_8_ = (ulong)((byte)(uVar5 >> 1) & 1) * auVar16._8_8_;
              auVar17._0_8_ = (ulong)((byte)uVar5 & 1) * auVar16._0_8_;
              auVar17._16_8_ = (ulong)((byte)(uVar5 >> 2) & 1) * auVar16._16_8_;
              auVar17._24_8_ = (ulong)((byte)(uVar5 >> 3) & 1) * auVar16._24_8_;
              auVar16 = vgatherqps_avx512f(*(undefined8 *)(unaff_R12 + 4));
              auVar30 = vinsertf64x4_avx512f
                                  (ZEXT3264(CONCAT824((ulong)((byte)(uVar6 >> 3) & 1) *
                                                      auVar16._24_8_,
                                                      CONCAT816((ulong)((byte)(uVar6 >> 2) & 1) *
                                                                auVar16._16_8_,
                                                                CONCAT88((ulong)((byte)(uVar6 >> 1)
                                                                                & 1) * auVar16._8_8_
                                                                         ,(ulong)((byte)uVar6 & 1) *
                                                                          auVar16._0_8_)))),auVar17,
                                   1);
              auVar30 = vsubps_avx512f(auVar30,auVar24);
              vscatterqps_avx512f(ZEXT864(4) + auVar29,uVar6,auVar30._0_32_);
              auVar16 = vextractf64x4_avx512f(auVar30,1);
              vscatterqps_avx512f(ZEXT864(4) + auVar28,uVar5,auVar16);
            } while (uVar11 != 0);
          }
          uVar13 = (undefined4)((ulong)lVar12 >> 0x20);
          if (count <= (int)uVar9) break;
          vfnmadd231ss_avx512f(auVar2,auVar15,auVar3);
          auVar2 = vucomiss_avx512f(ZEXT816(0) << 0x40);
        } while ((uint)count < uVar9);
      }
    }
    if (0 < count) {
      fVar31 = 0.0;
      uVar11 = 0;
      do {
        fVar1 = items[uVar11].Width;
        auVar2 = vcvtdq2ps_avx(ZEXT416((uint)(int)fVar1));
        items[uVar11].Width = auVar2._0_4_;
        uVar11 = uVar11 + 1;
        fVar31 = fVar31 + (fVar1 - auVar2._0_4_);
      } while ((uint)count != uVar11);
      if (0.0 < fVar31 && 0 < count) {
        auVar20 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar21 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar23 = vpbroadcastq_avx512f(ZEXT816(0x10));
        auVar24 = vpbroadcastq_avx512f();
        uVar11 = (ulong)(count + 0xfU & 0xfffffff0);
        auVar25 = vpbroadcastq_avx512f();
        auVar26 = vpbroadcastd_avx512f();
        do {
          uVar5 = vpcmpuq_avx512f(auVar22,auVar25,2);
          uVar6 = vpcmpuq_avx512f(auVar21,auVar25,2);
          auVar27 = vpsllq_avx512f(auVar21,3);
          auVar28 = vpsllq_avx512f(auVar22,3);
          uVar11 = uVar11 - 0x10;
          auVar27 = vpaddq_avx512f(auVar24,auVar27);
          auVar28 = vpaddq_avx512f(auVar24,auVar28);
          auVar16 = vpgatherqd_avx512f(*(undefined8 *)((long)items * 9));
          auVar22 = vpaddq_avx512f(auVar22,auVar23);
          auVar17 = vpgatherqd_avx512f(items[CONCAT44(uVar13,(int)(fVar31 + 0.01))]);
          auVar18._4_4_ = (uint)((byte)(uVar6 >> 1) & 1) * auVar17._4_4_;
          auVar18._0_4_ = (uint)((byte)uVar6 & 1) * auVar17._0_4_;
          auVar18._8_4_ = (uint)((byte)(uVar6 >> 2) & 1) * auVar17._8_4_;
          auVar18._12_4_ = (uint)((byte)(uVar6 >> 3) & 1) * auVar17._12_4_;
          auVar18._16_4_ = (uint)((byte)(uVar6 >> 4) & 1) * auVar17._16_4_;
          auVar18._20_4_ = (uint)((byte)(uVar6 >> 5) & 1) * auVar17._20_4_;
          auVar18._24_4_ = (uint)((byte)(uVar6 >> 6) & 1) * auVar17._24_4_;
          auVar18._28_4_ = (uint)(byte)(uVar6 >> 7) * auVar17._28_4_;
          auVar21 = vpaddq_avx512f(auVar21,auVar23);
          auVar29 = vinserti64x4_avx512f
                              (ZEXT3264(CONCAT428((uint)(byte)(uVar5 >> 7) * auVar16._28_4_,
                                                  CONCAT424((uint)((byte)(uVar5 >> 6) & 1) *
                                                            auVar16._24_4_,
                                                            CONCAT420((uint)((byte)(uVar5 >> 5) & 1)
                                                                      * auVar16._20_4_,
                                                                      CONCAT416((uint)((byte)(uVar5 
                                                  >> 4) & 1) * auVar16._16_4_,
                                                  CONCAT412((uint)((byte)(uVar5 >> 3) & 1) *
                                                            auVar16._12_4_,
                                                            CONCAT48((uint)((byte)(uVar5 >> 2) & 1)
                                                                     * auVar16._8_4_,
                                                                     CONCAT44((uint)((byte)(uVar5 >>
                                                                                           1) & 1) *
                                                                              auVar16._4_4_,
                                                                              (uint)((byte)uVar5 & 1
                                                                                    ) * auVar16.
                                                  _0_4_)))))))),auVar18,1);
          uVar4 = vpcmpgtd_avx512f(auVar26,auVar29);
          bVar7 = (byte)uVar5 & (byte)uVar4;
          bVar8 = (byte)uVar6 & (byte)((ulong)uVar4 >> 8);
          auVar16 = vgatherqps_avx512f(*(undefined8 *)(in_R8 + 4));
          auVar19._8_8_ = (ulong)(bVar8 >> 1 & 1) * auVar16._8_8_;
          auVar19._0_8_ = (ulong)(bVar8 & 1) * auVar16._0_8_;
          auVar19._16_8_ = (ulong)(bVar8 >> 2 & 1) * auVar16._16_8_;
          auVar19._24_8_ = (ulong)(bVar8 >> 3 & 1) * auVar16._24_8_;
          auVar16 = vgatherqps_avx512f(*(undefined8 *)&pIVar14->Width);
          auVar29 = vinsertf64x4_avx512f
                              (ZEXT3264(CONCAT824((ulong)(bVar7 >> 3 & 1) * auVar16._24_8_,
                                                  CONCAT816((ulong)(bVar7 >> 2 & 1) * auVar16._16_8_
                                                            ,CONCAT88((ulong)(bVar7 >> 1 & 1) *
                                                                      auVar16._8_8_,
                                                                      (ulong)(bVar7 & 1) *
                                                                      auVar16._0_8_)))),auVar19,1);
          auVar29 = vaddps_avx512f(auVar29,auVar20);
          vscatterqps_avx512f(ZEXT864(4) + auVar28,(ulong)bVar7,auVar29._0_32_);
          auVar16 = vextractf64x4_avx512f(auVar29,1);
          vscatterqps_avx512f(ZEXT864(4) + auVar27,(ulong)bVar8,auVar16);
        } while (uVar11 != 0);
      }
    }
  }
  return;
}

Assistant:

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem* items, int count, float width_excess)
{
    if (count == 1)
    {
        items[0].Width = ImMax(items[0].Width - width_excess, 1.0f);
        return;
    }
    ImQsort(items, (size_t)count, sizeof(ImGuiShrinkWidthItem), ShrinkWidthItemComparer);
    int count_same_width = 1;
    while (width_excess > 0.0f && count_same_width < count)
    {
        while (count_same_width < count && items[0].Width <= items[count_same_width].Width)
            count_same_width++;
        float max_width_to_remove_per_item = (count_same_width < count) ? (items[0].Width - items[count_same_width].Width) : (items[0].Width - 1.0f);
        float width_to_remove_per_item = ImMin(width_excess / count_same_width, max_width_to_remove_per_item);
        for (int item_n = 0; item_n < count_same_width; item_n++)
            items[item_n].Width -= width_to_remove_per_item;
        width_excess -= width_to_remove_per_item * count_same_width;
    }

    // Round width and redistribute remainder left-to-right (could make it an option of the function?)
    // Ensure that e.g. the right-most tab of a shrunk tab-bar always reaches exactly at the same distance from the right-most edge of the tab bar separator.
    width_excess = 0.0f;
    for (int n = 0; n < count; n++)
    {
        float width_rounded = ImFloor(items[n].Width);
        width_excess += items[n].Width - width_rounded;
        items[n].Width = width_rounded;
    }
    if (width_excess > 0.0f)
        for (int n = 0; n < count; n++)
            if (items[n].Index < (int)(width_excess + 0.01f))
                items[n].Width += 1.0f;
}